

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_internal.h
# Opt level: O3

ImPlotTick * __thiscall ImPlotTickCollection::Append(ImPlotTickCollection *this,ImPlotTick *tick)

{
  uint uVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ImPlotTick *__src;
  double dVar7;
  undefined8 uVar8;
  int iVar9;
  ImPlotTick *pIVar10;
  int iVar11;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  if (tick->ShowLabel == true) {
    fVar3 = (tick->LabelSize).x;
    this->TotalWidth = this->TotalWidth + fVar3;
    fVar4 = (tick->LabelSize).y;
    this->TotalHeight = this->TotalHeight + fVar4;
    uVar5 = this->MaxWidth;
    uVar6 = this->MaxHeight;
    auVar14._4_4_ = uVar6;
    auVar14._0_4_ = uVar5;
    auVar13._4_4_ = fVar4;
    auVar13._0_4_ = fVar3;
    auVar13._8_8_ = 0;
    auVar14._8_8_ = 0;
    auVar14 = maxps(auVar13,auVar14);
    this->MaxWidth = (float)(int)auVar14._0_8_;
    this->MaxHeight = (float)(int)((ulong)auVar14._0_8_ >> 0x20);
  }
  iVar9 = (this->Ticks).Size;
  if (iVar9 == (this->Ticks).Capacity) {
    if (iVar9 == 0) {
      iVar11 = 8;
    }
    else {
      iVar11 = iVar9 / 2 + iVar9;
    }
    iVar12 = iVar9 + 1;
    if (iVar9 + 1 < iVar11) {
      iVar12 = iVar11;
    }
    pIVar10 = (ImPlotTick *)ImGui::MemAlloc((long)iVar12 << 5);
    __src = (this->Ticks).Data;
    if (__src != (ImPlotTick *)0x0) {
      memcpy(pIVar10,__src,(long)(this->Ticks).Size << 5);
      ImGui::MemFree((this->Ticks).Data);
    }
    (this->Ticks).Data = pIVar10;
    (this->Ticks).Capacity = iVar12;
    iVar9 = (this->Ticks).Size;
  }
  else {
    pIVar10 = (this->Ticks).Data;
  }
  dVar7 = tick->PlotPos;
  fVar3 = tick->PixelPos;
  fVar4 = (tick->LabelSize).x;
  uVar8 = *(undefined8 *)&tick->Major;
  pfVar2 = &pIVar10[iVar9].LabelSize.y;
  *(undefined8 *)pfVar2 = *(undefined8 *)&(tick->LabelSize).y;
  *(undefined8 *)(pfVar2 + 2) = uVar8;
  pIVar10 = pIVar10 + iVar9;
  pIVar10->PlotPos = dVar7;
  pIVar10->PixelPos = fVar3;
  (pIVar10->LabelSize).x = fVar4;
  iVar9 = (this->Ticks).Size;
  uVar1 = iVar9 + 1;
  (this->Ticks).Size = uVar1;
  this->Size = this->Size + 1;
  if (-1 < iVar9) {
    return (this->Ticks).Data + ((ulong)uVar1 - 1);
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                ,0x695,"T &ImVector<ImPlotTick>::back() [T = ImPlotTick]");
}

Assistant:

const ImPlotTick& Append(const ImPlotTick& tick) {
        if (tick.ShowLabel) {
            TotalWidth    += tick.ShowLabel ? tick.LabelSize.x : 0;
            TotalHeight   += tick.ShowLabel ? tick.LabelSize.y : 0;
            MaxWidth      =  tick.LabelSize.x > MaxWidth  ? tick.LabelSize.x : MaxWidth;
            MaxHeight     =  tick.LabelSize.y > MaxHeight ? tick.LabelSize.y : MaxHeight;
        }
        Ticks.push_back(tick);
        Size++;
        return Ticks.back();
    }